

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_bn_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  undefined8 uVar1;
  uint in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  uint in_ESI;
  long lVar2;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 uVar19;
  undefined1 auVar4 [16];
  __m128i alVar20;
  long in_stack_00000008;
  __m128i v_res_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_a_b;
  __m128i v_rb_b;
  __m128i v_ra_b;
  int c;
  __m128i v_maxval_w;
  undefined8 local_118;
  undefined4 local_cc;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  
  local_a8 = in_R8;
  local_98 = in_RDX;
  local_88 = in_RDI;
  do {
    for (local_cc = 0; local_cc < (int)v_res_w[1]; local_cc = local_cc + 8) {
      xx_loadl_64((void *)(in_stack_00000008 + local_cc));
      alVar20 = xx_loadl_64((void *)(in_stack_00000008 + local_cc + (ulong)(uint)v_res_w[0]));
      local_68 = (undefined1)extraout_XMM0_Qa;
      uStack_67 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
      uStack_66 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_65 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
      uStack_64 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_63 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
      uStack_62 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
      uStack_61 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
      uStack_60 = (undefined1)extraout_XMM0_Qb;
      uStack_5f = (undefined1)((ulong)extraout_XMM0_Qb >> 8);
      uStack_5e = (undefined1)((ulong)extraout_XMM0_Qb >> 0x10);
      uStack_5d = (undefined1)((ulong)extraout_XMM0_Qb >> 0x18);
      uStack_5c = (undefined1)((ulong)extraout_XMM0_Qb >> 0x20);
      uStack_5b = (undefined1)((ulong)extraout_XMM0_Qb >> 0x28);
      uStack_5a = (undefined1)((ulong)extraout_XMM0_Qb >> 0x30);
      uStack_59 = (undefined1)((ulong)extraout_XMM0_Qb >> 0x38);
      local_78 = (undefined1)extraout_XMM0_Qa_00;
      uStack_77 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
      uStack_76 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      uStack_75 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
      uStack_74 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      uStack_73 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
      uStack_72 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      uStack_71 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
      uStack_70 = (undefined1)extraout_XMM0_Qb_00;
      uStack_6f = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 8);
      uStack_6e = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      uStack_6d = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x18);
      uStack_6c = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      uStack_6b = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x28);
      uStack_6a = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      uStack_69 = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x38);
      uVar3 = pavgb(local_68,local_78);
      uVar5 = pavgb(uStack_67,uStack_77);
      uVar6 = pavgb(uStack_66,uStack_76);
      uVar7 = pavgb(uStack_65,uStack_75);
      uVar8 = pavgb(uStack_64,uStack_74);
      uVar9 = pavgb(uStack_63,uStack_73);
      uVar10 = pavgb(uStack_62,uStack_72);
      uVar11 = pavgb(uStack_61,uStack_71);
      uVar12 = pavgb(uStack_60,uStack_70);
      uVar13 = pavgb(uStack_5f,uStack_6f);
      uVar14 = pavgb(uStack_5e,uStack_6e);
      uVar15 = pavgb(uStack_5d,uStack_6d);
      uVar16 = pavgb(uStack_5c,uStack_6c);
      uVar17 = pavgb(uStack_5b,uStack_6b);
      uVar18 = pavgb(uStack_5a,uStack_6a);
      uVar19 = pavgb(uStack_59,uStack_69);
      uVar1 = CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(uVar9,CONCAT14(uVar8,CONCAT13(uVar7,CONCAT12(
                                                  uVar6,CONCAT11(uVar5,uVar3)))))));
      auVar4[8] = uVar12;
      auVar4._0_8_ = uVar1;
      auVar4[9] = uVar13;
      auVar4[10] = uVar14;
      auVar4[0xb] = uVar15;
      auVar4[0xc] = uVar16;
      auVar4[0xd] = uVar17;
      auVar4[0xe] = uVar18;
      auVar4[0xf] = uVar19;
      auVar4 = pmovzxbw(auVar4,uVar1);
      local_118 = auVar4._0_8_;
      local_48 = auVar4._0_2_;
      uStack_46 = auVar4._2_2_;
      uStack_44 = auVar4._4_2_;
      uStack_42 = auVar4._6_2_;
      lVar2 = local_a8 + (long)local_cc * 2;
      (*(code *)v_m1_w[1])
                (local_118,
                 CONCAT26(0x40 - uStack_42,
                          CONCAT24(0x40 - uStack_44,CONCAT22(0x40 - uStack_46,0x40 - local_48))),
                 local_98 + (long)local_cc * 2,lVar2,alVar20[1]);
      alVar20[1] = extraout_RDX;
      alVar20[0] = lVar2;
      xx_storeu_128((void *)(local_88 + (long)local_cc * 2),alVar20);
    }
    local_88 = local_88 + (ulong)in_ESI * 2;
    local_98 = local_98 + (ulong)in_ECX * 2;
    local_a8 = local_a8 + (ulong)in_R9D * 2;
    in_stack_00000008 = in_stack_00000008 + (ulong)((uint)v_res_w[0] << 1);
    v_m1_w[0]._0_4_ = (int)v_m1_w[0] + -1;
  } while ((int)v_m1_w[0] != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_ra_b = xx_loadl_64(mask + c);
      const __m128i v_rb_b = xx_loadl_64(mask + c + mask_stride);
      const __m128i v_a_b = _mm_avg_epu8(v_ra_b, v_rb_b);

      const __m128i v_m0_w = _mm_cvtepu8_epi16(v_a_b);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}